

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O3

void __thiscall SpotLight_Sampling_Test::TestBody(SpotLight_Sampling_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  int i;
  long lVar3;
  Allocator alloc;
  char *pcVar4;
  char *in_R9;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  SampledSpectrum SVar18;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  SampledWavelengths lambda;
  optional<pbrt::LightLeSample> ls;
  SpotLight light;
  Transform id;
  AssertHelper local_2a8;
  long *local_2a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  string local_290;
  AssertHelper local_270;
  Float local_268;
  Float local_264;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_260;
  long local_258;
  SpectrumHandle local_250;
  SampledWavelengths local_248;
  undefined1 local_228 [152];
  bool local_190;
  SpotLight local_180;
  Transform local_b0;
  
  if (TestBody()::I == '\0') {
    TestBody();
  }
  lVar3 = 1;
  local_248.lambda.values[1] = 0.0;
  local_248.lambda.values[2] = 0.0;
  local_248.lambda.values[3] = 0.0;
  fVar8 = 595.0;
  local_248.lambda.values[0] = 595.0;
  do {
    fVar8 = fVar8 + 117.5;
    uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar8),SUB6416(ZEXT464(0x444f8000),0),0xe);
    bVar2 = (bool)((byte)uVar1 & 1);
    fVar8 = (float)((uint)bVar2 * (int)(fVar8 + -830.0 + 360.0) + (uint)!bVar2 * (int)fVar8);
    local_248.lambda.values[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_248.pdf.values[0] = 0.0021276595;
  local_248.pdf.values[1] = 0.0021276595;
  local_248.pdf.values[2] = 0.0021276595;
  local_248.pdf.values[3] = 0.0021276595;
  pbrt::Transform::Transform(&local_b0);
  local_258 = 0;
  local_260.bits = 0x1000002f2e768;
  do {
    local_228._0_8_ = 0;
    local_228._8_8_ = 0;
    local_250.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )local_260.bits;
    local_264 = (Float)*(int *)((long)&DAT_0054fa60 + local_258);
    local_268 = (Float)*(int *)((long)&DAT_0054fa64 + local_258);
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::SpotLight::SpotLight
              (&local_180,&local_b0,(MediumInterface *)local_228,&local_250,1.0,local_264,local_268,
               alloc);
    iVar7 = 100;
    uVar5 = 0x853c49e6748fea9b;
    do {
      auVar10 = vpmovsxbq_avx(ZEXT216(0x2d1b));
      auVar14 = vpmovsxbq_avx(ZEXT216(0x1b2d));
      auVar17._8_4_ = 0x3f7fffff;
      auVar17._0_8_ = 0x3f7fffff3f7fffff;
      auVar17._12_4_ = 0x3f7fffff;
      uVar6 = uVar5 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar5;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar6;
      auVar11 = vpunpcklqdq_avx(auVar11,auVar9);
      uVar5 = uVar6 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      auVar9 = vpsrlvq_avx2(auVar11,auVar10);
      auVar12 = vpsrlvq_avx2(auVar11,auVar14);
      auVar11 = vpsrlq_avx(auVar11,0x3b);
      auVar11 = vpshufd_avx(auVar11,0xe8);
      auVar9 = vpshufd_avx(auVar9 ^ auVar12,0xe8);
      auVar11 = vprorvd_avx512vl(auVar9,auVar11);
      auVar9 = vcvtudq2ps_avx512vl(auVar11);
      uVar6 = uVar5 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar5;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar6;
      auVar11 = vpunpcklqdq_avx(auVar13,auVar16);
      auVar12._0_4_ = auVar9._0_4_ * 2.3283064e-10;
      auVar12._4_4_ = auVar9._4_4_ * 2.3283064e-10;
      auVar12._8_4_ = auVar9._8_4_ * 2.3283064e-10;
      auVar12._12_4_ = auVar9._12_4_ * 2.3283064e-10;
      auVar10 = vpsrlvq_avx2(auVar11,auVar10);
      auVar9 = vpsrlvq_avx2(auVar11,auVar14);
      auVar14 = vpsrlq_avx(auVar11,0x3b);
      auVar14 = vpshufd_avx(auVar14,0xe8);
      auVar11 = vpshufd_avx(auVar10 ^ auVar9,0xe8);
      auVar10 = vminps_avx(auVar12,auVar17);
      auVar14 = vprorvd_avx512vl(auVar11,auVar14);
      auVar14 = vcvtudq2ps_avx512vl(auVar14);
      auVar15._0_4_ = auVar14._0_4_ * 2.3283064e-10;
      auVar15._4_4_ = auVar14._4_4_ * 2.3283064e-10;
      auVar15._8_4_ = auVar14._8_4_ * 2.3283064e-10;
      auVar15._12_4_ = auVar14._12_4_ * 2.3283064e-10;
      auVar14 = vminps_avx(auVar15,auVar17);
      pbrt::SpotLight::SampleLe
                ((optional<pbrt::LightLeSample> *)local_228,&local_180,(Point2f)auVar10._0_8_,
                 (Point2f)auVar14._0_8_,&local_248,0.0);
      local_298.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_190 == false) {
        testing::Message::Message((Message *)&local_2a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_290,(internal *)&local_2a0,(AssertionResult *)"ls.has_value()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x3d,(char *)CONCAT71(local_290._M_dataplus._M_p._1_7_,
                                          (char)local_290._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_270,(Message *)&local_2a8);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p) !=
            &local_290.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p
                                  ),local_290.field_2._M_allocated_capacity + 1);
        }
        if (((CONCAT44(local_2a8.data_._4_4_,local_2a8.data_._0_4_) != 0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           ((long *)CONCAT44(local_2a8.data_._4_4_,local_2a8.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_2a8.data_._4_4_,local_2a8.data_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_298,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_190 == false) {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
      }
      if ((((float)local_228._16_4_ != 0.0) || ((float)local_228._20_4_ != 0.0)) ||
         (NAN((float)local_228._20_4_))) {
        local_2a0 = (long *)((ulong)local_2a0._1_7_ << 8);
LAB_00250ce2:
        local_298.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)&local_2a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_290,(internal *)&local_2a0,
                   (AssertionResult *)"ls->ray.o == Point3f(0, 0, 0)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x3e,(char *)CONCAT71(local_290._M_dataplus._M_p._1_7_,
                                          (char)local_290._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_270,(Message *)&local_2a8);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p) !=
            &local_290.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p
                                  ),local_290.field_2._M_allocated_capacity + 1);
        }
        if (((CONCAT44(local_2a8.data_._4_4_,local_2a8.data_._0_4_) != 0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           ((long *)CONCAT44(local_2a8.data_._4_4_,local_2a8.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_2a8.data_._4_4_,local_2a8.data_._0_4_) + 8))();
        }
      }
      else {
        local_2a0 = (long *)CONCAT71(local_2a0._1_7_,(float)local_228._24_4_ == 0.0);
        local_298.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (((float)local_228._24_4_ != 0.0) || (NAN((float)local_228._24_4_))) goto LAB_00250ce2;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_298,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_2a0 = (long *)CONCAT44(local_2a0._4_4_,1);
      if (local_190 == false) {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
      }
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&local_290,"1","ls->pdfPos",(int *)&local_2a0,
                 (float *)(local_228 + 0x90));
      if ((char)local_290._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_2a0);
        pcVar4 = "";
        if ((undefined8 *)local_290._M_string_length != (undefined8 *)0x0) {
          pcVar4 = *(char **)local_290._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x3f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2a8,(Message *)&local_2a0);
        testing::internal::AssertHelper::~AssertHelper(&local_2a8);
        if (((local_2a0 != (long *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           (local_2a0 != (long *)0x0)) {
          (**(code **)(*local_2a0 + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_290._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      SVar18 = pbrt::SpotLight::Phi(&local_180,&local_248);
      if (local_190 == false) {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
      }
      local_2a0 = (long *)&DAT_3f50624dd2f1a9fc;
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(ZEXT416((uint)(SVar18.values.values[0] -
                                              (float)local_228._0_4_ / (float)local_228._148_4_)),
                                auVar10);
      local_2a8.data_._0_4_ = auVar10._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_290,"std::abs(light.Phi(lambda)[0] - (ls->L / ls->pdfDir)[0])",
                 "1e-3",(float *)&local_2a8,(double *)&local_2a0);
      if ((char)local_290._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_2a0);
        pcVar4 = "";
        if ((undefined8 *)local_290._M_string_length != (undefined8 *)0x0) {
          pcVar4 = *(char **)local_290._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x42,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2a8,(Message *)&local_2a0);
        testing::internal::AssertHelper::~AssertHelper(&local_2a8);
        if (((local_2a0 != (long *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           (local_2a0 != (long *)0x0)) {
          (**(code **)(*local_2a0 + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_290._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar5 = uVar6 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_180.Iemit.values);
    local_258 = local_258 + 8;
    if (local_258 == 0x20) {
      return;
    }
  } while( true );
}

Assistant:

TEST(SpotLight, Sampling) {
    static ConstantSpectrum I(10.);
    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);

    int widthStart[][2] = {{50, 0}, {40, 10}, {60, 5}, {70, 70}};
    Transform id;
    for (auto ws : widthStart) {
        SpotLight light(id, MediumInterface(), &I, 1.f /* scale */,
                        ws[0] /* total width */, ws[1] /* falloff start */,
                        Allocator());

        RNG rng;
        for (int i = 0; i < 100; ++i) {
            Point2f u1{rng.Uniform<Float>(), rng.Uniform<Float>()};
            Point2f u2{rng.Uniform<Float>(), rng.Uniform<Float>()};
            pstd::optional<LightLeSample> ls =
                light.SampleLe(u1, u2, lambda, 0 /* time */);
            EXPECT_TRUE(ls.has_value());
            EXPECT_TRUE(ls->ray.o == Point3f(0, 0, 0));
            EXPECT_EQ(1, ls->pdfPos);
            // Importance should be perfect, so a single sample should
            // compute power with zero variance.
            EXPECT_LT(std::abs(light.Phi(lambda)[0] - (ls->L / ls->pdfDir)[0]), 1e-3);
        }
    }
}